

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::anon_unknown_1::buildErrorUI(string *message,bool fatal)

{
  double dVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  float fVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar10 [12];
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  ImVec2 errorModalSize;
  ImVec4 local_48;
  string errorPopupString;
  undefined1 auVar9 [64];
  
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  errorPopupString._M_dataplus._M_p = (pointer)vmovlps_avx(auVar6);
  ImGui::PushStyleVar(5,(ImVec2 *)&errorPopupString);
  pcVar3 = "ERROR";
  if ((int)CONCAT71(in_register_00000031,fatal) != 0) {
    pcVar3 = "FATAL ERROR";
  }
  std::__cxx11::string::string((string *)&errorPopupString,pcVar3,(allocator *)&local_48);
  auVar9._8_56_ = extraout_var;
  auVar9._0_8_ = extraout_XMM1_Qa;
  auVar10 = auVar9._4_12_;
  ImGui::OpenPopup(errorPopupString._M_dataplus._M_p);
  IVar5 = ImGui::CalcTextSize((message->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
  auVar8._0_4_ = (float)view::windowWidth / 5.0;
  auVar8._4_12_ = auVar10;
  auVar6 = vminss_avx(ZEXT416((uint)((float)view::windowWidth * 0.5)),
                      ZEXT416((uint)(IVar5.x + 50.0)));
  auVar6 = vmaxss_avx(auVar6,auVar8);
  errorModalSize.x = auVar6._0_4_;
  errorModalSize.y = 0.0;
  ImGui::SetNextWindowSize(&errorModalSize,0);
  local_48.x = 0.6666667;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_48.w = 1.0;
  ImGui::PushStyleColor(0xb,&local_48);
  bVar2 = ImGui::BeginPopupModal(errorPopupString._M_dataplus._M_p,(bool *)0x0,4);
  if (!bVar2) goto LAB_001a9f6b;
  dVar1 = (double)(errorModalSize.x - IVar5.x) * 0.5 + -5.0;
  auVar7._0_4_ = (float)dVar1;
  auVar7._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar7._8_8_ = 0;
  auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,auVar7);
  fVar4 = auVar6._0_4_;
  if (0.0 < fVar4) {
    ImGui::Indent(fVar4);
  }
  ImGui::TextWrapped("%s",(message->_M_dataplus)._M_p);
  if (0.0 < fVar4) {
    ImGui::Unindent(fVar4);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)((errorModalSize.x + -120.0) * 0.5)));
  fVar4 = auVar6._0_4_;
  if (0.0 < fVar4) {
    ImGui::Indent(fVar4);
  }
  local_48._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x42f00000),0));
  bVar2 = ImGui::Button("My bad.",(ImVec2 *)&local_48);
  if (bVar2) {
LAB_001a9f2f:
    popContext();
    ImGui::CloseCurrentPopup();
  }
  else {
    bVar2 = ImGui::IsKeyPressed(0x20,true);
    if (bVar2) goto LAB_001a9f2f;
  }
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    ImGui::SetTooltip("(space to dismiss)");
  }
  if (0.0 < fVar4) {
    ImGui::Unindent(fVar4);
  }
LAB_001a9f6b:
  ImGui::EndPopup();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  std::__cxx11::string::~string((string *)&errorPopupString);
  return;
}

Assistant:

void buildErrorUI(std::string message, bool fatal) {

  ImGui::PushStyleVar(ImGuiStyleVar_WindowTitleAlign, ImVec2(0.5, 0.5));
  std::string errorPopupString = fatal ? "FATAL ERROR" : "ERROR";
  ImGui::OpenPopup(errorPopupString.c_str());

  // Nice size for error modal
  ImVec2 errorTextSize = ImGui::CalcTextSize(message.c_str());
  ImVec2 errorModalSize(std::max(view::windowWidth / 5.0f, std::min(errorTextSize.x + 50, view::windowWidth / 2.0f)),
                        0);

  ImGui::SetNextWindowSize(errorModalSize);
  ImGui::PushStyleColor(ImGuiCol_TitleBgActive, ImVec4(170. / 255., 0, 0, 1.0));
  if (ImGui::BeginPopupModal(errorPopupString.c_str(), NULL, ImGuiWindowFlags_NoMove)) {

    // Nice text sizing
    float offset = (errorModalSize.x - errorTextSize.x) / 2.0 - 5;
    offset = std::max(offset, 0.0f);
    bool doIndent = offset > 0;
    if (doIndent) {
      ImGui::Indent(offset);
    }

    // Make text
    ImGui::TextWrapped("%s", message.c_str());
    if (doIndent) {
      ImGui::Unindent(offset);
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice button sizing
    float buttonWidth = 120;
    float buttonOffset = (errorModalSize.x - buttonWidth) / 2.0;
    buttonOffset = std::max(buttonOffset, 0.0f);
    doIndent = buttonOffset > 0;
    if (doIndent) {
      ImGui::Indent(buttonOffset);
    }

    // Make a button
    if (ImGui::Button("My bad.", ImVec2(buttonWidth, 0)) || ImGui::IsKeyPressed((int)' ')) {
      popContext();
      ImGui::CloseCurrentPopup();
    }
    if (ImGui::IsItemHovered()) ImGui::SetTooltip("(space to dismiss)");

    if (doIndent) {
      ImGui::Unindent(buttonOffset);
    }
  }

  ImGui::EndPopup();
  ImGui::PopStyleColor();
  ImGui::PopStyleVar();
}